

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

CK_RV __thiscall Token::setSOPIN(Token *this,ByteString *oldPIN,ByteString *newPIN)

{
  ObjectStoreToken *pOVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  SecureDataManager *this_00;
  CK_RV CVar5;
  CK_ULONG flags;
  ByteString soPINBlob;
  ByteString userPINBlob;
  MutexLocker lock;
  ulong local_98;
  ByteString local_90;
  ByteString local_68;
  MutexLocker local_40;
  
  MutexLocker::MutexLocker(&local_40,this->tokenMutex);
  CVar5 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    iVar4 = (*this->token->_vptr_ObjectStoreToken[4])(this->token,&local_98);
    if ((char)iVar4 == '\0') {
      softHSMLog(3,"setSOPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x10a,"Could not get the token flags");
    }
    else {
      this_00 = (SecureDataManager *)operator_new(0xd0);
      SecureDataManager::getSOPINBlob(&local_90,this->sdm);
      SecureDataManager::getUserPINBlob(&local_68,this->sdm);
      SecureDataManager::SecureDataManager(this_00,&local_90,&local_68);
      local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_68.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_90.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      bVar2 = SecureDataManager::loginSO(this_00,oldPIN);
      (*this_00->_vptr_SecureDataManager[1])(this_00);
      if (bVar2) {
        bVar2 = SecureDataManager::setSOPIN(this->sdm,newPIN);
        if (bVar2) {
          pOVar1 = this->token;
          SecureDataManager::getSOPINBlob(&local_90,this->sdm);
          iVar4 = (**pOVar1->_vptr_ObjectStoreToken)(pOVar1,&local_90);
          local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_90.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          if ((char)iVar4 != '\0') {
            ByteString::ByteString(&local_90);
            ByteString::ByteString(&local_68);
            iVar4 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&local_90);
            if ((char)iVar4 == '\0') {
              uVar3 = false;
            }
            else {
              iVar4 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&local_68);
              uVar3 = (undefined1)iVar4;
            }
            this->valid = (bool)uVar3;
            local_98 = local_98 & 0xffffffffffefffff;
            (*this->token->_vptr_ObjectStoreToken[5])();
            local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_68.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_90.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            CVar5 = 0;
          }
        }
      }
      else {
        local_98 = local_98 | 0x100000;
        CVar5 = 0xa0;
        (*this->token->_vptr_ObjectStoreToken[5])();
      }
    }
  }
  MutexLocker::~MutexLocker(&local_40);
  return CVar5;
}

Assistant:

CK_RV Token::setSOPIN(ByteString& oldPIN, ByteString& newPIN)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Verify oldPIN
	SecureDataManager* verifier = new SecureDataManager(sdm->getSOPINBlob(), sdm->getUserPINBlob());
	bool result = verifier->loginSO(oldPIN);
	delete verifier;
	if (result == false)
	{
		flags |= CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		return CKR_PIN_INCORRECT;
	}

	if (sdm->setSOPIN(newPIN) == false) return CKR_GENERAL_ERROR;

	// Save PIN to token file
	if (token->setSOPIN(sdm->getSOPINBlob()) == false) return CKR_GENERAL_ERROR;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	flags &= ~CKF_SO_PIN_COUNT_LOW;
	token->setTokenFlags(flags);

	return CKR_OK;
}